

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::ShaderOperatorCase::~ShaderOperatorCase(ShaderOperatorCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOperatorCase_0213c3b0;
  deqp::gls::ShaderEvaluator::~ShaderEvaluator(&(this->m_evaluator).super_ShaderEvaluator);
  pcVar2 = (this->m_shaderOp)._M_dataplus._M_p;
  paVar1 = &(this->m_shaderOp).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  deqp::gls::ShaderRenderCase::~ShaderRenderCase(&this->super_ShaderRenderCase);
  return;
}

Assistant:

ShaderOperatorCase::~ShaderOperatorCase (void)
{
}